

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O0

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)2>::flush_output
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)2> *this,int outputs)

{
  int outputs_local;
  ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)2> *this_local;
  
  if ((outputs & 1U) != 0) {
    JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)1>,_HalfCycles,_1,_1>
    ::flush(&this->video_);
  }
  if ((outputs & 2U) != 0) {
    update_audio(this);
    Concurrency::AsyncTaskQueue<false,_true,_void>::perform(&this->audio_queue_);
  }
  return;
}

Assistant:

void flush_output(int outputs) override {
			if(outputs & Output::Video) {
				video_.flush();
			}

			if(outputs & Output::Audio) {
				update_audio();
				audio_queue_.perform();
			}

			if constexpr (model == Model::Plus3) {
				fdc_.flush();
			}
		}